

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_ntri_with_tet_nodes(REF_CELL ref_cell,REF_INT *nodes,REF_INT *ntri)

{
  REF_STATUS ref_private_macro_code_rxs_3;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT cell;
  REF_INT face [3];
  REF_INT *ntri_local;
  REF_INT *nodes_local;
  REF_CELL ref_cell_local;
  
  *ntri = 0;
  ref_private_macro_code_rxs = nodes[1];
  cell = nodes[2];
  face[0] = nodes[3];
  face._4_8_ = ntri;
  ref_cell_local._4_4_ =
       ref_cell_with(ref_cell,&ref_private_macro_code_rxs,&ref_private_macro_code_rxs_1);
  if ((ref_cell_local._4_4_ == 0) || (ref_cell_local._4_4_ == 5)) {
    if (ref_private_macro_code_rxs_1 != -1) {
      *(int *)face._4_8_ = *(int *)face._4_8_ + 1;
    }
    ref_private_macro_code_rxs = *nodes;
    cell = nodes[2];
    face[0] = nodes[3];
    ref_cell_local._4_4_ =
         ref_cell_with(ref_cell,&ref_private_macro_code_rxs,&ref_private_macro_code_rxs_1);
    if ((ref_cell_local._4_4_ == 0) || (ref_cell_local._4_4_ == 5)) {
      if (ref_private_macro_code_rxs_1 != -1) {
        *(int *)face._4_8_ = *(int *)face._4_8_ + 1;
      }
      ref_private_macro_code_rxs = *nodes;
      cell = nodes[3];
      face[0] = nodes[1];
      ref_cell_local._4_4_ =
           ref_cell_with(ref_cell,&ref_private_macro_code_rxs,&ref_private_macro_code_rxs_1);
      if ((ref_cell_local._4_4_ == 0) || (ref_cell_local._4_4_ == 5)) {
        if (ref_private_macro_code_rxs_1 != -1) {
          *(int *)face._4_8_ = *(int *)face._4_8_ + 1;
        }
        ref_private_macro_code_rxs = *nodes;
        cell = nodes[1];
        face[0] = nodes[2];
        ref_cell_local._4_4_ =
             ref_cell_with(ref_cell,&ref_private_macro_code_rxs,&ref_private_macro_code_rxs_1);
        if ((ref_cell_local._4_4_ == 0) || (ref_cell_local._4_4_ == 5)) {
          if (ref_private_macro_code_rxs_1 != -1) {
            *(int *)face._4_8_ = *(int *)face._4_8_ + 1;
          }
          ref_cell_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x496,"ref_cell_ntri_with_tet_nodes",(ulong)ref_cell_local._4_4_,"t0");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x490,"ref_cell_ntri_with_tet_nodes",(ulong)ref_cell_local._4_4_,"t0");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x48a,
             "ref_cell_ntri_with_tet_nodes",(ulong)ref_cell_local._4_4_,"t0");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x484,
           "ref_cell_ntri_with_tet_nodes",(ulong)ref_cell_local._4_4_,"t0");
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_ntri_with_tet_nodes(REF_CELL ref_cell,
                                                REF_INT *nodes, REF_INT *ntri) {
  REF_INT face[3], cell;

  *ntri = 0;

  face[0] = nodes[1];
  face[1] = nodes[2];
  face[2] = nodes[3];
  RXS(ref_cell_with(ref_cell, face, &cell), REF_NOT_FOUND, "t0");
  if (REF_EMPTY != cell) (*ntri)++;

  face[0] = nodes[0];
  face[1] = nodes[2];
  face[2] = nodes[3];
  RXS(ref_cell_with(ref_cell, face, &cell), REF_NOT_FOUND, "t0");
  if (REF_EMPTY != cell) (*ntri)++;

  face[0] = nodes[0];
  face[1] = nodes[3];
  face[2] = nodes[1];
  RXS(ref_cell_with(ref_cell, face, &cell), REF_NOT_FOUND, "t0");
  if (REF_EMPTY != cell) (*ntri)++;

  face[0] = nodes[0];
  face[1] = nodes[1];
  face[2] = nodes[2];
  RXS(ref_cell_with(ref_cell, face, &cell), REF_NOT_FOUND, "t0");
  if (REF_EMPTY != cell) (*ntri)++;

  return REF_SUCCESS;
}